

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O2

void __thiscall
DirectionCone_VectorInCone_Test::DirectionCone_VectorInCone_Test
          (DirectionCone_VectorInCone_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_03141cb8;
  return;
}

Assistant:

TEST(DirectionCone, VectorInCone) {
    RNG rng;
    for (int i = 0; i < 100; ++i) {
        DirectionCone dc = RandomCone(rng);

        for (int j = 0; j < 100; ++j) {
            Vector3f wRandom =
                SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
            Vector3f wClosest = dc.ClosestVectorInCone(wRandom);

            if (Inside(dc, wRandom))
                EXPECT_GT(Dot(wClosest, wRandom), .999);
            else {
                // Uniformly sample the circle at the cone's boundary and
                // keep the vector that's closest to wRandom.
                Float sinTheta = SafeSqrt(1 - dc.cosTheta * dc.cosTheta);
                Frame f = Frame::FromZ(dc.w);

                Vector3f wBest;
                Float bestDot = -1;
                const int nk = 1000;
                for (int k = 0; k < nk; ++k) {
                    Float phi = (k + .5) / nk * 2 * Pi;
                    Vector3f w = SphericalDirection(sinTheta, dc.cosTheta, phi);
                    w = f.FromLocal(w);
                    if (Dot(w, wRandom) > bestDot) {
                        wBest = w;
                        bestDot = Dot(w, wRandom);
                    }
                }
                EXPECT_GT(Dot(wBest, wClosest), .999)
                    << wBest << " vs " << wClosest << ", dot " << Dot(wBest, wClosest);
            }
        }
    }
}